

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O1

RayDifferential * __thiscall
pbrt::SurfaceInteraction::SpawnRay
          (RayDifferential *__return_storage_ptr__,SurfaceInteraction *this,RayDifferential *rayi,
          BSDF *bsdf,Vector3f *wi,BxDFFlags flags)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar19;
  undefined4 uVar20;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  ulong uVar18;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Point3fi *pPVar30;
  Point3fi *pPVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar47;
  undefined1 auVar46 [16];
  float fVar48;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  
  Interaction::SpawnRay(__return_storage_ptr__,&this->super_Interaction,wi);
  if (rayi->hasDifferentials == true) {
    uVar2 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar19 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar34._4_4_ = uVar19;
    auVar34._0_4_ = uVar2;
    auVar34._8_8_ = 0;
    uVar3 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
    uVar20 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar40._4_4_ = uVar20;
    auVar40._0_4_ = uVar3;
    auVar40._8_8_ = 0;
    uVar11._0_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar11._4_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar11;
    fVar1 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar45 = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    fVar47 = this->dudy;
    fVar52 = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    fVar48 = this->dvdy;
    fVar51 = fVar48 * fVar52 + fVar45 * fVar47;
    fVar50 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar12._0_4_ = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar12._4_4_ = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar12;
    uVar13._0_4_ = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar13._4_4_ = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar13;
    uVar14._0_4_ = this->dudx;
    uVar14._4_4_ = this->dvdx;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar14;
    auVar32 = vpermi2ps_avx512vl(_DAT_005ca5e0,auVar42,ZEXT416((uint)fVar52));
    auVar33 = vshufps_avx(auVar36,auVar36,0xe1);
    auVar33 = vmulps_avx512vl(auVar33,auVar32);
    auVar32 = vpermi2ps_avx512vl(ZEXT416(4),auVar35,ZEXT416((uint)fVar45));
    auVar32 = vmulps_avx512vl(auVar36,auVar32);
    auVar53._0_4_ = auVar33._0_4_ + auVar32._0_4_;
    auVar53._4_4_ = auVar33._4_4_ + auVar32._4_4_;
    auVar53._8_4_ = auVar33._8_4_ + auVar32._8_4_;
    auVar53._12_4_ = auVar33._12_4_ + auVar32._12_4_;
    uVar15._0_4_ = (rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar15._4_4_ = (rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar33._0_8_ = uVar15 ^ 0x8000000080000000;
    auVar33._8_4_ = 0x80000000;
    auVar33._12_4_ = 0x80000000;
    auVar32 = vsubps_avx(auVar33,auVar34);
    auVar56._0_4_ = (float)(undefined4)uVar14 * (float)(undefined4)uVar13;
    auVar56._4_4_ = (float)uVar14._4_4_ * (float)uVar13._4_4_;
    auVar56._8_8_ = 0;
    auVar33 = vmovshdup_avx512vl(auVar42);
    auVar34 = vmulss_avx512f(auVar36,auVar33);
    auVar33 = vmovshdup_avx(auVar56);
    fVar45 = auVar34._0_4_ + auVar33._0_4_;
    auVar59._0_4_ = (float)(undefined4)uVar13 * fVar48 + (float)(undefined4)uVar12 * fVar47;
    auVar59._4_4_ = (float)uVar13._4_4_ * fVar48 + (float)uVar12._4_4_ * fVar47;
    auVar59._8_4_ = fVar48 * 0.0 + fVar47 * 0.0;
    auVar59._12_4_ = fVar48 * 0.0 + fVar47 * 0.0;
    auVar33 = vmovshdup_avx(auVar40);
    fVar48 = auVar33._0_4_;
    fVar47 = -(rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z - fVar48;
    uVar16._0_4_ = (rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar16._4_4_ = (rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar38._0_8_ = uVar16 ^ 0x8000000080000000;
    auVar38._8_4_ = 0x80000000;
    auVar38._12_4_ = 0x80000000;
    fVar52 = -(rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x - fVar50;
    auVar34 = vsubps_avx(auVar38,auVar40);
    auVar56 = ZEXT416((uint)fVar1);
    auVar38 = ZEXT416((uint)fVar45);
    auVar42 = ZEXT416((uint)fVar52);
    if (flags == SpecularTransmission) {
      __return_storage_ptr__->hasDifferentials = true;
      pPVar30 = &(this->super_Interaction).pi;
      pPVar31 = &(this->super_Interaction).pi;
      auVar37._0_4_ =
           (pPVar30->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      auVar37._4_4_ =
           (pPVar30->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar37._8_4_ =
           (pPVar31->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar37._12_4_ =
           (pPVar31->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      fVar63 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
               (this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      auVar35 = vinsertps_avx(auVar37,ZEXT416((uint)(this->super_Interaction).pi.
                                                    super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
      auVar65._8_8_ = 0;
      auVar65._0_8_ =
           *(ulong *)&(this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar35 = vaddps_avx512vl(auVar65,auVar35);
      auVar39._8_4_ = 0x3f000000;
      auVar39._0_8_ = 0x3f0000003f000000;
      auVar39._12_4_ = 0x3f000000;
      auVar35 = vmulps_avx512vl(auVar35,auVar39);
      uVar8 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar25 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar66._4_4_ = uVar25;
      auVar66._0_4_ = uVar8;
      auVar66._8_8_ = 0;
      auVar36 = vaddps_avx512vl(auVar35,auVar66);
      auVar37 = vaddss_avx512f(ZEXT416((uint)fVar63),
                               ZEXT416((uint)(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z));
      uVar17 = vmovlps_avx512f(auVar36);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar17;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar17 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = auVar37._0_4_;
      uVar9 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar26 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar67._4_4_ = uVar26;
      auVar67._0_4_ = uVar9;
      auVar67._8_8_ = 0;
      auVar35 = vaddps_avx512vl(auVar35,auVar67);
      fVar62 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
      uVar17 = vmovlps_avx(auVar35);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar17;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar17 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = fVar63 + fVar62;
      fVar62 = 1.0 / bsdf->eta;
      auVar35 = vmovshdup_avx512vl(auVar44);
      auVar36 = vfmadd213ss_avx512f(auVar35,auVar40,ZEXT416((uint)(fVar48 * fVar1)));
      auVar35 = vfmsub231ss_fma(ZEXT416((uint)(fVar48 * fVar1)),auVar56,auVar33);
      auVar35 = vaddss_avx512f(auVar36,auVar35);
      auVar43 = ZEXT416((uint)fVar50);
      auVar35 = vfmadd231ss_fma(auVar35,auVar44,auVar43);
      vxorps_avx512vl(auVar36,auVar36);
      vucomiss_avx512f(auVar35);
      auVar36 = vmovshdup_avx(auVar59);
      auVar35 = vinsertps_avx(ZEXT416((uint)fVar51),auVar59,0x1c);
      auVar37 = vmovshdup_avx512vl(auVar32);
      auVar59 = vmovshdup_avx(auVar44);
      auVar39 = vfmadd213ss_avx512f(auVar37,auVar59,ZEXT416((uint)(fVar47 * fVar1)));
      auVar37 = vfmsub231ss_fma(ZEXT416((uint)(fVar47 * fVar1)),auVar56,ZEXT416((uint)fVar47));
      auVar37 = vaddss_avx512f(auVar39,auVar37);
      auVar37 = vfmadd231ss_fma(auVar37,auVar44,auVar32);
      auVar39 = vmulss_avx512f(auVar33,auVar38);
      auVar41 = vmovshdup_avx512vl(auVar53);
      auVar41 = vfmadd213ss_avx512f(auVar41,auVar40,auVar39);
      auVar38 = vfmsub231ss_avx512f(auVar39,auVar38,auVar33);
      auVar38 = vaddss_avx512f(auVar41,auVar38);
      auVar38 = vfmadd231ss_avx512f(auVar38,auVar53,auVar43);
      auVar37 = vaddss_avx512f(auVar38,auVar37);
      auVar38 = vmovshdup_avx(auVar34);
      auVar39 = vmulss_avx512f(auVar38,auVar56);
      auVar41 = vfmadd213ss_avx512f(auVar34,auVar59,auVar39);
      auVar38 = vfmsub213ss_avx512f(auVar38,auVar56,auVar39);
      auVar38 = vaddss_avx512f(auVar41,auVar38);
      auVar42 = vfmadd231ss_avx512f(auVar38,auVar44,auVar42);
      auVar38 = vmovshdup_avx(auVar35);
      auVar39 = vmulss_avx512f(auVar33,auVar36);
      auVar41 = vfmadd213ss_avx512f(auVar40,auVar38,auVar39);
      auVar39 = vfmsub231ss_avx512f(auVar39,auVar36,auVar33);
      auVar39 = vaddss_avx512f(auVar41,auVar39);
      auVar39 = vfmadd231ss_avx512f(auVar39,auVar35,auVar43);
      auVar42 = vaddss_avx512f(auVar39,auVar42);
      auVar39 = vmulss_avx512f(auVar33,auVar56);
      auVar40 = vfmadd213ss_avx512f(auVar40,auVar59,auVar39);
      auVar33 = vfmsub231ss_avx512f(auVar39,auVar56,auVar33);
      auVar33 = vaddss_avx512f(auVar40,auVar33);
      auVar33 = vfmadd231ss_fma(auVar33,auVar44,auVar43);
      fVar1 = (wi->super_Tuple3<pbrt::Vector3,_float>).x;
      auVar40 = vmulss_avx512f(ZEXT416((uint)(fVar62 * fVar62)),auVar33);
      auVar43._0_4_ = fVar62 * auVar34._0_4_;
      auVar43._4_4_ = fVar62 * auVar34._4_4_;
      auVar43._8_4_ = fVar62 * auVar34._8_4_;
      auVar43._12_4_ = fVar62 * auVar34._12_4_;
      uVar10 = (wi->super_Tuple3<pbrt::Vector3,_float>).x;
      uVar27 = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
      auVar68._4_4_ = uVar27;
      auVar68._0_4_ = uVar10;
      uVar18._0_4_ = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
      uVar18._4_4_ = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar18;
      auVar34 = vmovshdup_avx512vl(auVar69);
      auVar39 = vmulss_avx512f(auVar56,auVar34);
      auVar43 = vsubps_avx512vl(auVar69,auVar43);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar18;
      auVar41 = vfmadd213ss_avx512f(auVar70,auVar59,auVar39);
      auVar39 = vfmsub231ss_avx512f(auVar39,auVar56,auVar34);
      auVar39 = vaddss_avx512f(auVar41,auVar39);
      auVar44 = vfmadd231ss_avx512f(auVar39,auVar44,ZEXT416((uint)fVar1));
      auVar41._8_4_ = 0x7fffffff;
      auVar41._0_8_ = 0x7fffffff7fffffff;
      auVar41._12_4_ = 0x7fffffff;
      auVar44 = vandps_avx512vl(auVar44,auVar41);
      auVar33 = vfmsub213ss_fma(auVar33,ZEXT416((uint)fVar62),auVar44);
      auVar44 = vdivss_avx512f(auVar40,auVar44);
      auVar40 = ZEXT416((uint)(fVar62 - auVar44._0_4_));
      auVar44 = vmulss_avx512f(auVar37,auVar40);
      auVar40 = vmulss_avx512f(auVar42,auVar40);
      auVar34 = vsubss_avx512f(auVar34,ZEXT416((uint)(fVar47 * fVar62)));
      fVar47 = auVar33._0_4_;
      auVar33 = vmulss_avx512f(auVar56,auVar44);
      auVar33 = vaddss_avx512f(ZEXT416((uint)(fVar45 * fVar47)),auVar33);
      auVar55._0_4_ = fVar62 * auVar32._0_4_;
      auVar55._4_4_ = fVar62 * auVar32._4_4_;
      auVar55._8_4_ = fVar62 * auVar32._8_4_;
      auVar55._12_4_ = fVar62 * auVar32._12_4_;
      auVar68._8_8_ = 0;
      auVar32 = vsubps_avx512vl(auVar68,auVar55);
      fVar45 = auVar44._0_4_;
      auVar54._0_4_ = auVar32._0_4_ + fVar45 * (float)(undefined4)uVar11 + fVar47 * auVar53._0_4_;
      auVar54._4_4_ = auVar32._4_4_ + fVar45 * (float)uVar11._4_4_ + fVar47 * auVar53._4_4_;
      auVar54._8_4_ = auVar32._8_4_ + fVar45 * 0.0 + fVar47 * auVar53._8_4_;
      auVar54._12_4_ = auVar32._12_4_ + fVar45 * 0.0 + fVar47 * auVar53._12_4_;
      uVar17 = vmovlps_avx(auVar54);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar17;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar17 >> 0x20);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           auVar34._0_4_ + auVar33._0_4_;
      auVar33 = vinsertps_avx(auVar38,auVar36,0x10);
      fVar45 = auVar40._0_4_;
      fVar1 = (fVar1 - fVar52 * fVar62) +
              auVar35._0_4_ * fVar47 + fVar45 * (float)(undefined4)uVar11;
      auVar32 = vinsertps_avx(auVar59,auVar56,0x10);
      auVar46._0_4_ = auVar43._0_4_ + fVar47 * auVar33._0_4_ + auVar32._0_4_ * fVar45;
      auVar46._4_4_ = auVar43._4_4_ + fVar47 * auVar33._4_4_ + auVar32._4_4_ * fVar45;
      auVar46._8_4_ = auVar43._8_4_ + fVar47 * auVar33._8_4_ + auVar32._8_4_ * fVar45;
      auVar46._12_4_ = auVar43._12_4_ + fVar47 * auVar33._12_4_ + auVar32._12_4_ * fVar45;
    }
    else {
      if (flags != SpecularReflection) goto LAB_0050ee5d;
      __return_storage_ptr__->hasDifferentials = true;
      pPVar30 = &(this->super_Interaction).pi;
      pPVar31 = &(this->super_Interaction).pi;
      auVar28._0_4_ =
           (pPVar30->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      auVar28._4_4_ =
           (pPVar30->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar28._8_4_ =
           (pPVar31->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar28._12_4_ =
           (pPVar31->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      fVar62 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
               (this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      uVar17 = *(undefined8 *)
                &(this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar35 = vinsertps_avx(auVar28,ZEXT416((uint)(this->super_Interaction).pi.
                                                    super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
      auVar60._0_4_ = (float)uVar17 + auVar35._0_4_;
      auVar60._4_4_ = (float)((ulong)uVar17 >> 0x20) + auVar35._4_4_;
      auVar60._8_4_ = auVar35._8_4_ + 0.0;
      auVar60._12_4_ = auVar35._12_4_ + 0.0;
      auVar29._8_4_ = 0x3f000000;
      auVar29._0_8_ = 0x3f0000003f000000;
      auVar29._12_4_ = 0x3f000000;
      auVar35 = vmulps_avx512vl(auVar60,auVar29);
      uVar4 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar21 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar64._0_4_ = auVar35._0_4_ + (float)uVar4;
      auVar64._4_4_ = auVar35._4_4_ + (float)uVar21;
      auVar64._8_4_ = auVar35._8_4_ + 0.0;
      auVar64._12_4_ = auVar35._12_4_ + 0.0;
      auVar36 = vaddss_avx512f(ZEXT416((uint)fVar62),
                               ZEXT416((uint)(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z));
      uVar17 = vmovlps_avx(auVar64);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar17;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar17 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = auVar36._0_4_;
      uVar5 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar22 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar61._0_4_ = auVar35._0_4_ + (float)uVar5;
      auVar61._4_4_ = auVar35._4_4_ + (float)uVar22;
      auVar61._8_4_ = auVar35._8_4_ + 0.0;
      auVar61._12_4_ = auVar35._12_4_ + 0.0;
      fVar52 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
      uVar17 = vmovlps_avx(auVar61);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar17;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar17 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = fVar62 + fVar52;
      auVar35 = vmovshdup_avx(auVar44);
      auVar36 = vmovshdup_avx(auVar32);
      auVar36 = vfmadd213ss_fma(auVar36,auVar35,ZEXT416((uint)(fVar47 * fVar1)));
      auVar37 = vfmsub231ss_fma(ZEXT416((uint)(fVar47 * fVar1)),auVar56,ZEXT416((uint)fVar47));
      auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ + auVar37._0_4_)),auVar44,auVar32);
      auVar37 = vmovshdup_avx512vl(auVar53);
      auVar37 = vfmadd213ss_avx512f(auVar37,auVar40,ZEXT416((uint)(fVar48 * fVar45)));
      auVar38 = vfmsub231ss_fma(ZEXT416((uint)(fVar48 * fVar45)),auVar38,auVar33);
      auVar38 = vaddss_avx512f(auVar37,auVar38);
      auVar41 = ZEXT416((uint)fVar50);
      auVar38 = vfmadd231ss_fma(auVar38,auVar53,auVar41);
      fVar52 = auVar38._0_4_ + auVar36._0_4_;
      auVar38 = vmovshdup_avx(auVar34);
      auVar36 = vmulss_avx512f(auVar56,auVar38);
      auVar37 = vfmadd213ss_avx512f(auVar34,auVar35,auVar36);
      auVar38 = vfmsub213ss_avx512f(auVar38,auVar56,auVar36);
      auVar38 = vaddss_avx512f(auVar37,auVar38);
      auVar38 = vfmadd231ss_fma(auVar38,auVar44,auVar42);
      auVar36 = vmovshdup_avx512vl(auVar59);
      auVar37 = vmulss_avx512f(auVar36,auVar33);
      auVar39 = vfmadd213ss_avx512f(auVar40,auVar59,auVar37);
      auVar36 = vfmsub213ss_avx512f(auVar36,auVar33,auVar37);
      auVar36 = vaddss_avx512f(auVar39,auVar36);
      auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar51),auVar41);
      auVar38 = vaddss_avx512f(auVar36,auVar38);
      auVar36 = vmulss_avx512f(auVar56,auVar33);
      auVar40 = vfmadd213ss_avx512f(auVar40,auVar35,auVar36);
      auVar33 = vfmsub231ss_avx512f(auVar36,auVar56,auVar33);
      auVar33 = vaddss_avx512f(auVar40,auVar33);
      auVar33 = vfmadd231ss_fma(auVar33,auVar44,auVar41);
      fVar62 = auVar33._0_4_;
      fVar45 = fVar45 * fVar62 + fVar52 * fVar1;
      auVar33 = vsubss_avx512f(ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).x),auVar42);
      fVar63 = auVar38._0_4_;
      fVar1 = fVar51 * fVar62 + fVar63 * (float)(undefined4)uVar11;
      fVar1 = fVar1 + fVar1 + auVar33._0_4_;
      uVar6 = (wi->super_Tuple3<pbrt::Vector3,_float>).x;
      uVar23 = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
      auVar57._4_4_ = uVar23;
      auVar57._0_4_ = uVar6;
      auVar57._8_8_ = 0;
      uVar7 = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
      uVar24 = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
      auVar58._4_4_ = uVar24;
      auVar58._0_4_ = uVar7;
      auVar58._8_8_ = 0;
      auVar33 = vmovshdup_avx(auVar58);
      fVar48 = auVar53._0_4_ * fVar62 + fVar52 * (float)(undefined4)uVar11;
      fVar50 = auVar53._4_4_ * fVar62 + fVar52 * (float)uVar11._4_4_;
      fVar51 = auVar53._8_4_ * fVar62 + fVar52 * 0.0;
      fVar52 = auVar53._12_4_ * fVar62 + fVar52 * 0.0;
      auVar32 = vsubps_avx(auVar57,auVar32);
      auVar49._0_4_ = fVar48 + fVar48 + auVar32._0_4_;
      auVar49._4_4_ = fVar50 + fVar50 + auVar32._4_4_;
      auVar49._8_4_ = fVar51 + fVar51 + auVar32._8_4_;
      auVar49._12_4_ = fVar52 + fVar52 + auVar32._12_4_;
      uVar17 = vmovlps_avx(auVar49);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar17;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar17 >> 0x20);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           (auVar33._0_4_ - fVar47) + fVar45 + fVar45;
      auVar32 = vsubps_avx(auVar58,auVar34);
      auVar33 = vinsertps_avx(auVar35,auVar56,0x10);
      fVar45 = auVar59._0_4_ * fVar62 + auVar33._0_4_ * fVar63;
      fVar47 = auVar59._4_4_ * fVar62 + auVar33._4_4_ * fVar63;
      fVar52 = auVar59._8_4_ * fVar62 + auVar33._8_4_ * fVar63;
      fVar48 = auVar59._12_4_ * fVar62 + auVar33._12_4_ * fVar63;
      auVar46._0_4_ = fVar45 + fVar45 + auVar32._0_4_;
      auVar46._4_4_ = fVar47 + fVar47 + auVar32._4_4_;
      auVar46._8_4_ = fVar52 + fVar52 + auVar32._8_4_;
      auVar46._12_4_ = fVar48 + fVar48 + auVar32._12_4_;
    }
    auVar33 = vunpcklps_avx(ZEXT416((uint)fVar1),auVar46);
    uVar17 = vmovlps_avx(auVar33);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar17;
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar17 >> 0x20);
    fVar1 = (float)vextractps_avx(auVar46,1);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = fVar1;
  }
LAB_0050ee5d:
  fVar1 = (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar33 = ZEXT416((uint)(__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x
                   );
  auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar33,auVar33);
  auVar32 = ZEXT416((uint)(__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z
                   );
  auVar33 = vfmadd213ss_fma(auVar32,auVar32,auVar33);
  if (auVar33._0_4_ <= 1e+16) {
    fVar1 = (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar33 = ZEXT416((uint)(__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>
                            .x);
    auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar33,auVar33);
    auVar32 = ZEXT416((uint)(__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>
                            .z);
    auVar33 = vfmadd213ss_fma(auVar32,auVar32,auVar33);
    if (auVar33._0_4_ <= 1e+16) {
      fVar1 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
      auVar33 = ZEXT416((uint)(__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x
                       );
      auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar33,auVar33);
      auVar32 = ZEXT416((uint)(__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z
                       );
      auVar33 = vfmadd231ss_fma(auVar33,auVar32,auVar32);
      if (auVar33._0_4_ <= 1e+16) {
        fVar1 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
        auVar33 = ZEXT416((uint)(__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>
                                .x);
        auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar33,auVar33);
        auVar32 = ZEXT416((uint)(__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>
                                .z);
        auVar33 = vfmadd231ss_fma(auVar33,auVar32,auVar32);
        if (auVar33._0_4_ <= 1e+16) {
          return __return_storage_ptr__;
        }
      }
    }
  }
  __return_storage_ptr__->hasDifferentials = false;
  return __return_storage_ptr__;
}

Assistant:

RayDifferential SurfaceInteraction::SpawnRay(const RayDifferential &rayi,
                                             const BSDF &bsdf, const Vector3f &wi,
                                             BxDFFlags flags) const {
    RayDifferential rd(SpawnRay(wi));
    if (rayi.hasDifferentials) {
        // Compute ray differentials for specular reflection or transmission
        // Compute common factors for specular ray differentials
        Normal3f ns = shading.n;
        Normal3f dndx = shading.dndu * dudx + shading.dndv * dvdx;
        Normal3f dndy = shading.dndu * dudy + shading.dndv * dvdy;
        Vector3f dwodx = -rayi.rxDirection - wo, dwody = -rayi.ryDirection - wo;

        if (flags == (BxDFFlags::Reflection | BxDFFlags::Specular)) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential reflected directions
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection = wi - dwodx + 2.f * Vector3f(Dot(wo, ns) * dndx + dDNdx * ns);
            rd.ryDirection = wi - dwody + 2.f * Vector3f(Dot(wo, ns) * dndy + dDNdy * ns);

        } else if (flags == (BxDFFlags::Transmission | BxDFFlags::Specular)) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential transmitted directions
            // NOTE: eta coming in is now 1/eta from the derivation below, so
            // there's a 1/ here now...
            Float eta = 1 / bsdf.eta;
            if (Dot(wo, ns) < 0) {
                ns = -ns;
                dndx = -dndx;
                dndy = -dndy;
            }
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            // Compute partial derivatives of $\mu$
            Float mu = eta * Dot(wo, ns) - AbsDot(wi, ns);
            Float dmudx = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dDNdx;
            Float dmudy = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dDNdy;

            rd.rxDirection = wi - eta * dwodx + Vector3f(mu * dndx + dmudx * ns);
            rd.ryDirection = wi - eta * dwody + Vector3f(mu * dndy + dmudy * ns);
        }
    }
    // Squash potentially troublesome differentials
    // After many specuar bounces (e.g. the Transparent Machines scenes),
    // differentials can drift off to have large magnitudes, which ends up
    // leaving a trail of Infs and NaNs in their wake. We'll disable the
    // differentials when this seems to be happening.
    //
    // TODO: this is unsatisfying and would be nice to address in a more
    // principled way.
    if (LengthSquared(rd.rxDirection) > 1e16f || LengthSquared(rd.ryDirection) > 1e16f ||
        LengthSquared(Vector3f(rd.rxOrigin)) > 1e16f ||
        LengthSquared(Vector3f(rd.ryOrigin)) > 1e16f)
        rd.hasDifferentials = false;

    return rd;
}